

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O2

void char_test(char *filename,FILE *fp)

{
  int override;
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  bidi_char *bcs;
  ulong uVar4;
  uint *order;
  size_t bcs_len;
  uint lineno;
  long lVar5;
  size_t order_len;
  ptrlen pVar6;
  ptrlen pl_00;
  ptrlen pVar7;
  ptrlen pl;
  size_t order_size;
  size_t bcs_size;
  
  bcs_size = 0;
  order_size = 0;
  order = (uint *)0x0;
  bcs = (bidi_char *)0x0;
  lineno = 0;
  while( true ) {
    pcVar1 = fgetline(fp);
    pcVar1 = chomp(pcVar1);
    if (pcVar1 == (char *)0x0) break;
    lineno = lineno + 1;
    if ((*pcVar1 != '\0') && (*pcVar1 != '#')) {
      pl.len = strlen(pcVar1);
      pl.ptr = pcVar1;
      pVar6 = ptrlen_get_word(&pl,";");
      pl_00 = ptrlen_get_word(&pl,";");
      ptrlen_get_word(&pl,";");
      ptrlen_get_word(&pl,";");
      pVar7 = ptrlen_get_word(&pl,";");
      pcVar2 = mkstr(pl_00);
      uVar3 = strtoul(pcVar2,(char **)0x0,0);
      safefree(pcVar2);
      override = -(uint)((int)uVar3 == 1);
      lVar5 = 10;
      bcs_len = 0;
      pl.len = pVar6.len;
      while (pl.ptr = pVar6.ptr, pVar6.len != 0) {
        pVar6 = ptrlen_get_word(&pl," ");
        pcVar2 = mkstr(pVar6);
        bcs = (bidi_char *)safegrowarray(bcs,&bcs_size,0xc,bcs_len,1,false);
        uVar4 = strtoul(pcVar2,(char **)0x0,0x10);
        *(int *)((long)bcs + lVar5 + -6) = (int)uVar4;
        *(int *)((long)bcs + lVar5 + -10) = (int)uVar4;
        *(short *)((long)bcs + lVar5 + -2) = (short)bcs_len;
        *(undefined2 *)((long)&bcs->origwc + lVar5) = 1;
        bcs_len = bcs_len + 1;
        safefree(pcVar2);
        pVar6.len = pl.len;
        pVar6.ptr = pl.ptr;
        lVar5 = lVar5 + 0xc;
      }
      order_len = 0;
      pl.len = pVar7.len;
      while (pl.ptr = pVar7.ptr, pVar7.len != 0) {
        pVar6 = ptrlen_get_word(&pl," ");
        pcVar2 = mkstr(pVar6);
        order = (uint *)safegrowarray(order,&order_size,4,order_len,1,false);
        uVar4 = strtoul(pcVar2,(char **)0x0,0);
        order[order_len] = (uint)uVar4;
        order_len = order_len + 1;
        safefree(pcVar2);
        pVar7.len = pl.len;
        pVar7.ptr = pl.ptr;
      }
      if ((int)uVar3 == 0) {
        override = 1;
      }
      run_test(filename,lineno,bcs,bcs_len,order,order_len,override);
    }
    safefree(pcVar1);
  }
  safefree(bcs);
  safefree(order);
  return;
}

Assistant:

static void char_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Break each test line up into its main fields */
        ptrlen input_pl, para_dir_pl, order_pl;
        {
            ptrlen pl = ptrlen_from_asciz(line);
            input_pl = ptrlen_get_word(&pl, ";");
            para_dir_pl = ptrlen_get_word(&pl, ";");
            ptrlen_get_word(&pl, ";"); /* paragraph level, which we ignore */
            ptrlen_get_word(&pl, ";"); /* embedding levels, which we ignore */
            order_pl = ptrlen_get_word(&pl, ";");
        }

        int override;
        {
            char *para_dir_str = mkstr(para_dir_pl);
            unsigned para_dir = strtoul(para_dir_str, NULL, 0);
            sfree(para_dir_str);

            override = (para_dir == 0 ? +1 : para_dir == 1 ? -1 : 0);
        }

        /* Break up the input into Unicode characters */
        bcs_len = 0;
        {
            ptrlen pl = input_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(bcs, bcs_size, bcs_len);
                bcs[bcs_len].wc = strtoul(chrstr, NULL, 16);
                bcs[bcs_len].origwc = bcs[bcs_len].wc;
                bcs[bcs_len].index = bcs_len;
                bcs[bcs_len].nchars = 1;
                bcs_len++;
                sfree(chrstr);
            }
        }

        /* Ditto the expected output order */
        order_len = 0;
        {
            ptrlen pl = order_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(chrstr, NULL, 0);
                sfree(chrstr);
            }
        }

        run_test(filename, lineno, bcs, bcs_len, order, order_len, override);
        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}